

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O3

int __thiscall TPZSFMatrix<long_double>::Decompose_LDLt(TPZSFMatrix<long_double> *this)

{
  char cVar1;
  longdouble lVar2;
  longdouble lVar3;
  int iVar4;
  int extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  longdouble in_ST0;
  longdouble lVar10;
  longdouble lVar11;
  longdouble in_ST1;
  longdouble lVar12;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar13;
  longdouble in_ST6;
  longdouble lVar14;
  longdouble local_48;
  
  cVar1 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed;
  if (cVar1 != '\0') {
    if (cVar1 == '\x04') {
      return 0;
    }
    TPZMatrix<long_double>::Error
              ("virtual int TPZSFMatrix<long double>::Decompose_LDLt() [TVar = long double]",
               "Decompose_LDLt <Matrix already Decomposed with a different scheme>");
  }
  iVar4 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(this);
  if (CONCAT44(extraout_var,iVar4) != 0 && -1 < extraout_var) {
    lVar7 = 1;
    lVar8 = 0;
    do {
      lVar12 = (longdouble)0;
      lVar10 = in_ST0;
      lVar11 = in_ST1;
      lVar2 = in_ST2;
      lVar3 = in_ST3;
      lVar13 = in_ST4;
      if (lVar8 != 0) {
        lVar5 = 0;
        lVar12 = (longdouble)0;
        do {
          lVar11 = in_ST4;
          lVar10 = in_ST3;
          lVar13 = in_ST6;
          (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(this,lVar5,lVar5);
          (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(this,lVar5,lVar8);
          lVar14 = lVar13;
          (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(this,lVar5,lVar8);
          lVar12 = lVar12 + in_ST0 * in_ST1 * in_ST2;
          lVar5 = lVar5 + 1;
          in_ST0 = lVar10;
          in_ST1 = lVar11;
          lVar2 = in_ST5;
          in_ST2 = in_ST5;
          lVar3 = in_ST6;
          in_ST3 = in_ST6;
          in_ST4 = lVar13;
          in_ST5 = lVar14;
          in_ST6 = lVar14;
        } while (lVar8 != lVar5);
      }
      in_ST4 = in_ST6;
      in_ST3 = in_ST5;
      in_ST2 = lVar13;
      in_ST1 = lVar3;
      in_ST0 = lVar2;
      (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x24])(this,lVar8,lVar8);
      local_48 = lVar10 - lVar12;
      in_ST5 = in_ST4;
      (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x23])(this,lVar8,lVar8,&local_48);
      (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x24])(this,lVar8,lVar8);
      in_ST6 = in_ST5;
      if (ABS(lVar11) < (longdouble)1e-16) {
        TPZMatrix<long_double>::Error
                  ("virtual int TPZSFMatrix<long double>::Decompose_LDLt() [TVar = long double]",
                   "Decompose_LDLt <Zero on diagonal>");
      }
      lVar5 = lVar8 + 1;
      iVar4 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0xc])(this);
      lVar6 = lVar7;
      if (lVar5 < CONCAT44(extraout_var_00,iVar4)) {
        do {
          lVar12 = (longdouble)0;
          lVar10 = in_ST0;
          lVar11 = in_ST1;
          lVar2 = in_ST2;
          lVar3 = in_ST3;
          lVar13 = in_ST4;
          if (lVar8 != 0) {
            lVar9 = 0;
            lVar12 = (longdouble)0;
            do {
              lVar11 = in_ST4;
              lVar10 = in_ST3;
              lVar13 = in_ST6;
              (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])(this,lVar9,lVar9);
              (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])(this,lVar8,lVar9);
              lVar14 = lVar13;
              (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])(this,lVar6,lVar9);
              lVar12 = lVar12 + in_ST0 * in_ST1 * in_ST2;
              lVar9 = lVar9 + 1;
              in_ST0 = lVar10;
              in_ST1 = lVar11;
              lVar2 = in_ST5;
              in_ST2 = in_ST5;
              lVar3 = in_ST6;
              in_ST3 = in_ST6;
              in_ST4 = lVar13;
              in_ST5 = lVar14;
              in_ST6 = lVar14;
            } while (lVar8 != lVar9);
          }
          in_ST4 = in_ST6;
          in_ST3 = in_ST5;
          in_ST2 = lVar13;
          in_ST1 = lVar3;
          in_ST0 = lVar2;
          (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(this,lVar6,lVar8);
          in_ST5 = in_ST4;
          (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(this,lVar8,lVar8);
          local_48 = (lVar10 - lVar12) / lVar11;
          in_ST6 = in_ST5;
          (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x23])(this,lVar6,lVar8,&local_48);
          lVar6 = lVar6 + 1;
          iVar4 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
                    _vptr_TPZSavable[0xc])(this);
        } while (lVar6 < CONCAT44(extraout_var_01,iVar4));
      }
      iVar4 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0xc])(this);
      lVar7 = lVar7 + 1;
      lVar8 = lVar5;
    } while (lVar5 < CONCAT44(extraout_var_02,iVar4));
  }
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = '\x04';
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDefPositive = '\0';
  return 1;
}

Assistant:

int
TPZSFMatrix<TVar> ::Decompose_LDLt()
{
	if (  this->fDecomposed && this->fDecomposed != ELDLt)
		TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__,"Decompose_LDLt <Matrix already Decomposed with a different scheme>" );
	else if ( this->fDecomposed ) return 0;
	
	//	TVar sum;
	
	
	for ( auto j = 0; j < this->Dim(); j++ )
    {
		TVar sum=0.;
		for ( auto k=0; k<j; k++){
			if constexpr (is_complex<TVar>::value){
				sum+=GetVal(k,k)*std::conj(GetVal(k,j))*GetVal(k,j);
			}else{
				sum+=GetVal(k,k)*GetVal(k,j)*GetVal(k,j);
			}
		}
		PutVal(j,j,GetVal(j,j)-sum);
		if ( IsZero(GetVal(j,j)) )TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__,"Decompose_LDLt <Zero on diagonal>" );
		for( auto l=j+1; l<this->Dim();l++)
		{
			sum = 0;
			for ( auto k=0; k<j; k++){
				if constexpr(is_complex<TVar>::value){
					sum+=GetVal(k,k)*std::conj(GetVal(j,k))*GetVal(l,k);
				}else{
					sum+=GetVal(k,k)*GetVal(j,k)*GetVal(l,k);
				}
			}
			PutVal(l,j, (GetVal(l,j)-sum)/GetVal(j,j) );
		}
		
    }
	this->fDecomposed  = ELDLt;
	this->fDefPositive = 0;
	
    
	return( 1 );
}